

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O3

Gia_Man_t * Bmc_SuperBuildTents(Gia_Man_t *p,Vec_Int_t **pvMap)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  Vec_Int_t *vIns;
  int *piVar6;
  Vec_Int_t *vCuts;
  Vec_Int_t *p_00;
  Vec_Int_t *vObjs;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *p_04;
  Vec_Int_t *vRankIns;
  Vec_Int_t *vRankCuts;
  Vec_Int_t *p_05;
  Gia_Man_t *p_06;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  Gia_Man_t *pGVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  long local_60;
  
  vIns = (Vec_Int_t *)malloc(0x10);
  vIns->nCap = 1000;
  vIns->nSize = 0;
  piVar6 = (int *)malloc(4000);
  vIns->pArray = piVar6;
  vCuts = (Vec_Int_t *)malloc(0x10);
  vCuts->nCap = 1000;
  vCuts->nSize = 0;
  piVar6 = (int *)malloc(4000);
  vCuts->pArray = piVar6;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p_00->pArray = piVar6;
  vObjs = (Vec_Int_t *)malloc(0x10);
  vObjs->nCap = 1000;
  vObjs->nSize = 0;
  piVar6 = (int *)malloc(4000);
  vObjs->pArray = piVar6;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p_01->pArray = piVar6;
  p_02 = (Vec_Int_t *)malloc(0x10);
  p_02->nCap = 1000;
  p_02->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p_02->pArray = piVar6;
  p_03 = (Vec_Int_t *)malloc(0x10);
  p_03->nCap = 1000;
  p_03->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p_03->pArray = piVar6;
  p_04 = (Vec_Int_t *)malloc(0x10);
  p_04->nCap = 1000;
  p_04->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p_04->pArray = piVar6;
  vRankIns = (Vec_Int_t *)malloc(0x10);
  vRankIns->nCap = 1000;
  vRankIns->nSize = 0;
  piVar6 = (int *)malloc(4000);
  vRankIns->pArray = piVar6;
  vRankCuts = (Vec_Int_t *)malloc(0x10);
  vRankCuts->nCap = 1000;
  vRankCuts->nSize = 0;
  piVar6 = (int *)malloc(4000);
  vRankCuts->pArray = piVar6;
  p_05 = (Vec_Int_t *)malloc(0x10);
  p_05->nCap = 1000;
  p_05->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p_05->pArray = piVar6;
  pVVar10 = p->vCos;
  uVar12 = (ulong)(uint)pVVar10->nSize;
  if (p->nRegs < pVVar10->nSize) {
    lVar13 = 0;
    do {
      if ((int)uVar12 <= lVar13) goto LAB_005767e4;
      iVar15 = pVVar10->pArray[lVar13];
      if ((iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_00576803;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Vec_IntPush(p_00,iVar15);
      lVar13 = lVar13 + 1;
      pVVar10 = p->vCos;
      uVar12 = (ulong)pVVar10->nSize;
    } while (lVar13 < (long)(uVar12 - (long)p->nRegs));
  }
  Gia_ManCleanMark01(p);
  uVar12 = (ulong)(uint)p_00->nSize;
  if (0 < p_00->nSize) {
    local_60 = 0;
    uVar18 = 0;
    do {
      if (p_00->pArray[(uVar12 & 0xffffffff) - 1] <= (int)uVar18) {
        Gia_ManCleanMark01(p);
        Vec_IntPush(p_01,vIns->nSize);
        Vec_IntPush(p_02,vCuts->nSize);
        Vec_IntPush(p_03,p_00->nSize);
        Vec_IntPush(p_04,vObjs->nSize);
        p_06 = Gia_ManStart(p->nObjs);
        pcVar2 = p->pName;
        if (pcVar2 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
        else {
          sVar7 = strlen(pcVar2);
          pcVar8 = (char *)malloc(sVar7 + 1);
          strcpy(pcVar8,pcVar2);
        }
        p_06->pName = pcVar8;
        pcVar2 = p->pSpec;
        if (pcVar2 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
        else {
          sVar7 = strlen(pcVar2);
          pcVar8 = (char *)malloc(sVar7 + 1);
          strcpy(pcVar8,pcVar2);
        }
        p_06->pSpec = pcVar8;
        Gia_ManFillValue(p);
        p->pObjs->Value = 0;
        if (vIns->nSize < 1) goto LAB_00576240;
        lVar13 = 0;
        goto LAB_00576144;
      }
      Vec_IntPush(p_01,vIns->nSize);
      Vec_IntPush(p_02,vCuts->nSize);
      Vec_IntPush(p_03,p_00->nSize);
      Vec_IntPush(p_04,vObjs->nSize);
      uVar12 = (ulong)p_00->nSize;
      if ((long)uVar12 < 1) break;
      uVar14 = p_00->pArray[uVar12 - 1];
      if ((int)uVar18 < (int)uVar14) {
        uVar17 = uVar18;
        do {
          if (((int)uVar18 < 0) || (p_00->nSize <= (int)uVar17)) goto LAB_005767e4;
          Gia_ManIncrementTravId(p);
          if (p->nObjs <= (int)uVar18) goto LAB_00576803;
          Bmc_SuperBuildTents_rec
                    (p,uVar18 - (*(uint *)(p->pObjs + uVar18) & 0x1fffffff),vIns,vCuts,p_00,vObjs,
                     vRankIns,vRankCuts,(int)local_60);
          uVar17 = uVar17 + 1;
        } while (uVar14 != uVar17);
        uVar12 = (ulong)(uint)p_00->nSize;
      }
      local_60 = local_60 + 1;
      uVar18 = uVar14;
    } while (0 < (int)uVar12);
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  while( true ) {
    pGVar9 = Gia_ManAppendObj(p_06);
    uVar12 = *(ulong *)pGVar9;
    *(ulong *)pGVar9 = uVar12 | 0x9fffffff;
    *(ulong *)pGVar9 =
         uVar12 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_06->vCis->nSize & 0x1fffffff) << 0x20;
    pGVar4 = p_06->pObjs;
    if ((pGVar9 < pGVar4) || (pGVar4 + p_06->nObjs <= pGVar9)) goto LAB_00576841;
    Vec_IntPush(p_06->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
    pGVar4 = p_06->pObjs;
    if ((pGVar9 < pGVar4) || (pGVar4 + p_06->nObjs <= pGVar9)) goto LAB_00576841;
    pGVar3[iVar15].Value = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
    lVar13 = lVar13 + 1;
    if (vIns->nSize <= lVar13) break;
LAB_00576144:
    iVar15 = vIns->pArray[lVar13];
    if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_00576803;
    pGVar3 = p->pObjs;
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
  }
LAB_00576240:
  uVar12 = (ulong)(uint)vCuts->nSize;
  if (0 < vCuts->nSize) {
    lVar13 = 0;
    do {
      iVar15 = vCuts->pArray[lVar13];
      if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_00576803;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_06);
      uVar12 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar12 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar12 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_06->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_06->pObjs;
      if ((pGVar9 < pGVar4) || (pGVar4 + p_06->nObjs <= pGVar9)) {
LAB_00576841:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_06->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_06->pObjs;
      if ((pGVar9 < pGVar4) || (pGVar4 + p_06->nObjs <= pGVar9)) goto LAB_00576841;
      pGVar3[iVar15].Value = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
      lVar13 = lVar13 + 1;
      uVar12 = (ulong)vCuts->nSize;
    } while (lVar13 < (long)uVar12);
  }
  uVar18 = p_03->nSize;
  lVar13 = local_60;
  do {
    if (((int)uVar18 <= (int)local_60) || ((ulong)uVar18 <= lVar13 + 1U)) goto LAB_005767e4;
    piVar6 = p_03->pArray;
    uVar14 = piVar6[lVar13];
    uVar16 = (ulong)uVar14;
    if ((int)uVar14 < piVar6[lVar13 + 1]) {
      do {
        if (((int)uVar14 < 0) || (p_00->nSize <= (int)uVar16)) goto LAB_005767e4;
        iVar15 = p_00->pArray[uVar16];
        if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_00576803;
        pGVar3 = p->pObjs + iVar15;
        if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0)
        goto LAB_00576822;
        pGVar3->Value =
             (uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
             pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value;
        uVar16 = uVar16 + 1;
      } while ((int)uVar16 < piVar6[lVar13 + 1]);
    }
    if ((p_04->nSize <= (int)lVar13) || (p_04->nSize <= (int)(lVar13 + 1U))) goto LAB_005767e4;
    piVar6 = p_04->pArray;
    uVar14 = piVar6[lVar13];
    uVar16 = (ulong)uVar14;
    if ((int)uVar14 < piVar6[lVar13 + 1]) {
      do {
        if (((int)uVar14 < 0) || (vObjs->nSize <= (int)uVar16)) goto LAB_005767e4;
        iVar15 = vObjs->pArray[uVar16];
        if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_00576803;
        pGVar3 = p->pObjs + iVar15;
        if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0)
        goto LAB_00576822;
        pGVar3->Value =
             (uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
             pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value;
        uVar16 = uVar16 + 1;
      } while ((int)uVar16 < piVar6[lVar13 + 1]);
    }
    bVar5 = 0 < lVar13;
    lVar13 = lVar13 + -1;
  } while (bVar5);
  pVVar10 = p->vCos;
  uVar16 = (ulong)(uint)pVVar10->nSize;
  if (p->nRegs < pVVar10->nSize) {
    lVar13 = 0;
    do {
      if ((int)uVar16 <= lVar13) goto LAB_005767e4;
      iVar15 = pVVar10->pArray[lVar13];
      if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_00576803;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar15;
      uVar14 = (uint)*(undefined8 *)pGVar3;
      uVar18 = pGVar3[-(ulong)(uVar14 & 0x1fffffff)].Value;
      if ((int)uVar18 < 0) goto LAB_00576822;
      Gia_ManAppendCo(p_06,uVar14 >> 0x1d & 1 ^ uVar18);
      lVar13 = lVar13 + 1;
      pVVar10 = p->vCos;
      uVar16 = (ulong)pVVar10->nSize;
    } while (lVar13 < (long)(uVar16 - (long)p->nRegs));
    uVar12 = (ulong)(uint)vCuts->nSize;
  }
  iVar15 = (int)uVar12;
  if (0 < iVar15) {
    lVar13 = 0;
    do {
      iVar15 = (int)uVar12;
      iVar1 = vCuts->pArray[lVar13];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_00576803:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar1;
      uVar14 = (uint)*(undefined8 *)pGVar3;
      uVar18 = pGVar3[-(ulong)(uVar14 & 0x1fffffff)].Value;
      if ((int)uVar18 < 0) {
LAB_00576822:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_06,uVar14 >> 0x1d & 1 ^ uVar18);
      lVar13 = lVar13 + 1;
      iVar15 = vCuts->nSize;
      uVar12 = (ulong)iVar15;
    } while (lVar13 < (long)uVar12);
  }
  Gia_ManSetRegNum(p_06,iVar15);
  if (0 < vIns->nSize) {
    lVar13 = 0;
    do {
      if (vRankIns->nSize <= lVar13) goto LAB_005767e4;
      iVar15 = vRankIns->pArray[lVar13];
      Vec_IntPush(p_05,vIns->pArray[lVar13]);
      Vec_IntPush(p_05,iVar15);
      lVar13 = lVar13 + 1;
    } while (lVar13 < vIns->nSize);
  }
  if (0 < vCuts->nSize) {
    lVar13 = 0;
    do {
      if (vRankCuts->nSize <= lVar13) {
LAB_005767e4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar15 = vRankCuts->pArray[lVar13];
      Vec_IntPush(p_05,vCuts->pArray[lVar13]);
      Vec_IntPush(p_05,iVar15);
      lVar13 = lVar13 + 1;
    } while (lVar13 < vCuts->nSize);
  }
  if (vIns->pArray != (int *)0x0) {
    free(vIns->pArray);
  }
  free(vIns);
  if (vCuts->pArray != (int *)0x0) {
    free(vCuts->pArray);
  }
  free(vCuts);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (vObjs->pArray != (int *)0x0) {
    free(vObjs->pArray);
  }
  free(vObjs);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
  }
  free(p_01);
  if (p_02->pArray != (int *)0x0) {
    free(p_02->pArray);
  }
  free(p_02);
  if (p_03->pArray != (int *)0x0) {
    free(p_03->pArray);
  }
  free(p_03);
  if (p_04->pArray != (int *)0x0) {
    free(p_04->pArray);
  }
  free(p_04);
  if (vRankIns->pArray != (int *)0x0) {
    free(vRankIns->pArray);
  }
  free(vRankIns);
  if (vRankCuts->pArray != (int *)0x0) {
    free(vRankCuts->pArray);
  }
  free(vRankCuts);
  if (pvMap == (Vec_Int_t **)0x0) {
    if (p_05->pArray != (int *)0x0) {
      free(p_05->pArray);
    }
    free(p_05);
  }
  else {
    *pvMap = p_05;
  }
  pGVar11 = Gia_ManCleanup(p_06);
  Gia_ManStop(p_06);
  return pGVar11;
}

Assistant:

Gia_Man_t * Bmc_SuperBuildTents( Gia_Man_t * p, Vec_Int_t ** pvMap )
{
    Vec_Int_t * vIns      = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCuts     = Vec_IntAlloc( 1000 );
    Vec_Int_t * vFlops    = Vec_IntAlloc( 1000 );
    Vec_Int_t * vObjs     = Vec_IntAlloc( 1000 );
    Vec_Int_t * vLimIns   = Vec_IntAlloc( 1000 );
    Vec_Int_t * vLimCuts  = Vec_IntAlloc( 1000 );
    Vec_Int_t * vLimFlops = Vec_IntAlloc( 1000 );
    Vec_Int_t * vLimObjs  = Vec_IntAlloc( 1000 );
    Vec_Int_t * vRankIns  = Vec_IntAlloc( 1000 );
    Vec_Int_t * vRankCuts = Vec_IntAlloc( 1000 );
    Vec_Int_t * vMap      = Vec_IntAlloc( 1000 );
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, r, Entry, Rank, iPrev, iThis = 0;
    // collect internal nodes
    Gia_ManForEachPo( p, pObj, i )
        Vec_IntPush( vFlops, Gia_ObjId(p, pObj) );
    Gia_ManCleanMark01( p );
    for ( Rank = 0; iThis < Vec_IntEntryLast(vFlops); Rank++ )
    {
        Vec_IntPush( vLimIns,   Vec_IntSize(vIns)   );
        Vec_IntPush( vLimCuts,  Vec_IntSize(vCuts)  );
        Vec_IntPush( vLimFlops, Vec_IntSize(vFlops) );
        Vec_IntPush( vLimObjs,  Vec_IntSize(vObjs)  );
        iPrev = iThis;
        iThis = Vec_IntEntryLast(vFlops);
        Vec_IntForEachEntryStartStop( vFlops, Entry, i, iPrev, iThis )
        {
            Gia_ManIncrementTravId( p );
            Bmc_SuperBuildTents_rec( p, Gia_ObjFaninId0(Gia_ManObj(p, iPrev), iPrev), vIns, vCuts, vFlops, vObjs, vRankIns, vRankCuts, Rank );
        }
    }
    Gia_ManCleanMark01( p );
    Vec_IntPush( vLimIns,   Vec_IntSize(vIns)   );
    Vec_IntPush( vLimCuts,  Vec_IntSize(vCuts)  );
    Vec_IntPush( vLimFlops, Vec_IntSize(vFlops) );
    Vec_IntPush( vLimObjs,  Vec_IntSize(vObjs)  );
    // create new GIA
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObjVec( vIns, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachObjVec( vCuts, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    for ( r = Rank; r >= 0; r-- )
    {
        Vec_IntForEachEntryStartStop( vFlops, Entry, i, Vec_IntEntry(vLimFlops, r), Vec_IntEntry(vLimFlops, r+1) )
        {
            pObj = Gia_ManObj(p, Entry);
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        }
        Vec_IntForEachEntryStartStop( vObjs, Entry, i, Vec_IntEntry(vLimObjs, r), Vec_IntEntry(vLimObjs, r+1) )
        {
            pObj = Gia_ManObj(p, Entry);
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        }
    }
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachObjVec( vCuts, p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Vec_IntSize(vCuts) );

    // create map
    Vec_IntForEachEntryTwo( vIns, vRankIns, Entry, Rank, i )
        Vec_IntPushTwo( vMap, Entry, Rank );
    Vec_IntForEachEntryTwo( vCuts, vRankCuts, Entry, Rank, i )
        Vec_IntPushTwo( vMap, Entry, Rank );

    Vec_IntFree( vIns   );
    Vec_IntFree( vCuts  );
    Vec_IntFree( vFlops );
    Vec_IntFree( vObjs  );

    Vec_IntFree( vLimIns   );
    Vec_IntFree( vLimCuts  );
    Vec_IntFree( vLimFlops );
    Vec_IntFree( vLimObjs  );

    Vec_IntFree( vRankIns  );
    Vec_IntFree( vRankCuts  );

    if ( pvMap )
        *pvMap = vMap;
    else
        Vec_IntFree( vMap );

    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}